

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandPrintKMap(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  long lVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  uint fUseRealNames;
  char *format;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  fUseRealNames = 1;
  while (iVar1 = Extra_UtilGetopt(argc,argv,"nh"), iVar1 == 0x6e) {
    fUseRealNames = fUseRealNames ^ 1;
  }
  if (iVar1 == -1) {
    lVar2 = (long)globalUtilOptind;
    if (globalUtilOptind + 2 == argc) {
      Abc_NtkShow6VarFunc(argv[lVar2],argv[lVar2 + 1]);
      return 0;
    }
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar4 = "Empty network.\n";
    }
    else {
      if (pNtk->ntkType == ABC_NTK_LOGIC) {
        if (argc <= globalUtilOptind + 1) {
          if (globalUtilOptind == argc) {
            pAVar3 = Abc_NtkPo(pNtk,0);
            pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
            if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7) {
LAB_001e858b:
              Abc_NtkToBdd(pNtk);
              Abc_NodePrintKMap(pAVar3,fUseRealNames);
              return 0;
            }
            pcVar4 = Abc_ObjName(pAVar3);
            format = "The driver \"%s\" of the first PO is not an internal node.\n";
          }
          else {
            pAVar3 = Abc_NtkFindNode(pNtk,argv[lVar2]);
            if (pAVar3 != (Abc_Obj_t *)0x0) goto LAB_001e858b;
            pcVar4 = argv[globalUtilOptind];
            format = "Cannot find node \"%s\".\n";
          }
          Abc_Print(-1,format,pcVar4);
          return 1;
        }
        Abc_Print(-1,"Wrong number of auguments.\n");
        goto LAB_001e84a1;
      }
      pcVar4 = "Visualization of Karnaugh maps works for logic networks.\n";
    }
    iVar1 = -1;
  }
  else {
LAB_001e84a1:
    iVar1 = -2;
    Abc_Print(-2,"usage: print_kmap [-nh] <node>\n");
    Abc_Print(-2,"\t        shows the truth table of the node\n");
    pcVar4 = "real";
    if (fUseRealNames == 0) {
      pcVar4 = "dummy";
    }
    Abc_Print(-2,"\t-n    : toggles real/dummy fanin names [default = %s]\n",pcVar4);
    Abc_Print(-2,"\t-h    : print the command usage\n");
    pcVar4 = "\t<node>: the node to consider (default = the driver of the first PO)\n";
  }
  Abc_Print(iVar1,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandPrintKMap( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c;
    int fUseRealNames;

    extern void Abc_NodePrintKMap( Abc_Obj_t * pNode, int fUseRealNames );

    // set defaults
    fUseRealNames = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "nh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            fUseRealNames ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 2 )
    {
        Abc_NtkShow6VarFunc( argv[globalUtilOptind], argv[globalUtilOptind+1] );
        return 0;
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "Visualization of Karnaugh maps works for logic networks.\n" );
        return 1;
    }
    if ( argc > globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }
    if ( argc == globalUtilOptind )
    {
        pNode = Abc_ObjFanin0( Abc_NtkPo(pNtk, 0) );
        if ( !Abc_ObjIsNode(pNode) )
        {
            Abc_Print( -1, "The driver \"%s\" of the first PO is not an internal node.\n", Abc_ObjName(pNode) );
            return 1;
        }
    }
    else
    {
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
        if ( pNode == NULL )
        {
            Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
    }
    Abc_NtkToBdd(pNtk);
    Abc_NodePrintKMap( pNode, fUseRealNames );
    return 0;

usage:
    Abc_Print( -2, "usage: print_kmap [-nh] <node>\n" );
    Abc_Print( -2, "\t        shows the truth table of the node\n" );
    Abc_Print( -2, "\t-n    : toggles real/dummy fanin names [default = %s]\n", fUseRealNames? "real": "dummy" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    Abc_Print( -2, "\t<node>: the node to consider (default = the driver of the first PO)\n");
    return 1;
}